

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O0

bool MoveCeiling(sector_t_conflict *sector,int crush,double move)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double move_local;
  int crush_local;
  sector_t_conflict *sector_local;
  
  secplane_t::ChangeHeight(&sector->ceilingplane,move);
  sector_t::ChangePlaneTexZ((sector_t *)sector,1,move);
  bVar1 = P_ChangeSector(sector,crush,move,1,true);
  if (bVar1) {
    sector_local._7_1_ = false;
  }
  else {
    bVar1 = secplane_t::isSlope(&sector->ceilingplane);
    if (((!bVar1) && (bVar1 = secplane_t::isSlope(&sector->floorplane), !bVar1)) &&
       (bVar1 = sector_t::PortalIsLinked((sector_t *)sector,0), !bVar1)) {
      dVar2 = sector_t::GetPlaneTexZ((sector_t *)sector,0);
      dVar3 = sector_t::GetPlaneTexZ((sector_t *)sector,1);
      if (dVar3 < dVar2) {
        return false;
      }
    }
    sector_local._7_1_ = true;
  }
  return sector_local._7_1_;
}

Assistant:

static bool MoveCeiling(sector_t *sector, int crush, double move)
{
	sector->ceilingplane.ChangeHeight (move);
	sector->ChangePlaneTexZ(sector_t::ceiling, move);

	if (P_ChangeSector(sector, crush, move, 1, true)) return false;

	// Don't let the ceiling go below the floor
	if (!sector->ceilingplane.isSlope() && !sector->floorplane.isSlope() &&
		!sector->PortalIsLinked(sector_t::floor) &&
		sector->GetPlaneTexZ(sector_t::floor)  > sector->GetPlaneTexZ(sector_t::ceiling)) return false;

	return true;
}